

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O2

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)1>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  MonoSample output;
  int iVar10;
  
  uVar5 = 0;
  do {
    if (number_of_samples <= uVar5) {
      return;
    }
    sVar1 = this->per_channel_volume_;
    iVar10 = 0;
    for (lVar9 = 0xc; lVar9 != 0xe; lVar9 = lVar9 + 1) {
      iVar4 = *(int *)(this->volume_ + lVar9 * 4 + -8) + 1;
      *(int *)(this->volume_ + lVar9 * 4 + -8) = iVar4;
      uVar3 = (long)iVar4 / 0x13;
      if (0xf < this->volume_[lVar9 + -8]) {
        uVar8 = 0;
        goto LAB_002cfc20;
      }
      iVar4 = (int)uVar3;
      uVar7 = iVar4 >> 0x1f;
      switch(this->volume_[lVar9 + -8]) {
      default:
        uVar8 = 1;
        break;
      case '\x01':
        uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
        uVar8 = uVar7 & 1;
        if (iVar4 == this->volume_[lVar9 + -10] + 1) {
          *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
          *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
               (uVar7 << 2 ^ uVar7 * 8) & 8 | (int)uVar7 >> 1;
        }
        break;
      case '\x02':
        uVar2 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
        uVar8 = uVar2 & 1;
        if ((int)((long)((ulong)uVar7 << 0x20 | uVar3 & 0xffffffff) %
                 (long)(int)((uint)this->volume_[lVar9 + -10] * 0x1e + 0x1e)) == 0x12) {
          *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
               (uVar2 << 2 ^ uVar2 * 8) & 8 | (int)uVar2 >> 1;
        }
        break;
      case '\x03':
        uVar8 = *(uint *)(this->volume_ + lVar9 * 4 + -0x10);
        if (iVar4 == this->volume_[lVar9 + -10] + 1) {
          uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x20);
          if ((uVar7 & 1) != 0) {
            uVar2 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
            *(uint *)(this->volume_ + lVar9 * 4 + -0x10) = uVar2 & 1;
            *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
                 (uVar2 << 2 ^ uVar2 * 8) & 8 | (int)uVar2 >> 1;
          }
          *(uint *)(this->volume_ + lVar9 * 4 + -0x20) =
               (uVar7 << 2 ^ uVar7 << 4) & 0x10 | (int)uVar7 >> 1;
        }
        break;
      case '\x04':
      case '\x05':
        iVar4 = this->volume_[lVar9 + -10] + 1;
        goto LAB_002cfa68;
      case '\x06':
      case '\n':
        iVar4 = this->volume_[lVar9 + -10] + 1;
        goto LAB_002cfa9f;
      case '\a':
      case '\t':
        uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x20);
        iVar6 = this->volume_[lVar9 + -10] + 1;
        goto LAB_002cfbb8;
      case '\b':
        uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x18);
        uVar8 = uVar7 & 1;
        if (iVar4 == this->volume_[lVar9 + -10] + 1) {
          *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
          *(uint *)(this->volume_ + lVar9 * 4 + -0x18) =
               (uVar7 << 8 ^ uVar7 << 4) & 0x100 | (int)uVar7 >> 1;
        }
        break;
      case '\f':
      case '\r':
        iVar4 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_002cfa68:
        uVar8 = (uint)((long)((ulong)uVar7 << 0x20 | uVar3 & 0xffffffff) / (long)iVar4) & 1;
        break;
      case '\x0e':
        iVar4 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_002cfa9f:
        uVar3 = (long)((ulong)uVar7 << 0x20 | uVar3 & 0xffffffff) / (long)iVar4;
        uVar8 = (uint)((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff)
                            % 0x1e) < 0x13);
        break;
      case '\x0f':
        uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x20);
        iVar6 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_002cfbb8:
        uVar8 = uVar7 & 1;
        if (iVar4 == iVar6) {
          *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
          *(uint *)(this->volume_ + lVar9 * 4 + -0x20) =
               (uVar7 << 2 ^ uVar7 << 4) & 0x10 | (int)uVar7 >> 1;
        }
      }
LAB_002cfc20:
      iVar10 = iVar10 + (this->volume_[lVar9 + -0xc] * uVar8 * (int)sVar1 >> 4);
    }
    target[uVar5] = target[uVar5] + (short)iVar10;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}